

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3FindInIndex(Parse *pParse,Expr *pX,u32 inFlags,int *prRhsHasNull,int *aiMap,int *piTab)

{
  byte bVar1;
  LogEst LVar2;
  short sVar3;
  ushort uVar4;
  ExprList *pEVar5;
  SrcList *pSVar6;
  Table *pTab;
  Schema *pSVar7;
  undefined1 auVar8 [16];
  u8 uVar9;
  char cVar10;
  int iVar11;
  uint uVar12;
  Vdbe *p;
  Expr *pEVar13;
  Expr *pLeft;
  CollSeq *pCVar14;
  char aff2;
  Select *pSVar15;
  long lVar16;
  Schema **ppSVar17;
  Op *pOVar18;
  ulong uVar19;
  int iVar20;
  ulong uVar21;
  Index *pIdx;
  ulong uVar22;
  int p1;
  ExprList_item *pEVar23;
  uint uVar24;
  ulong uVar25;
  ExprList_item *pEVar26;
  long in_FS_OFFSET;
  bool bVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  Walker local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  p = sqlite3GetVdbe(pParse);
  p1 = pParse->nTab;
  pParse->nTab = p1 + 1;
  if (prRhsHasNull == (int *)0x0) {
    prRhsHasNull = (int *)0x0;
  }
  else if ((pX->flags & 0x1000) != 0) {
    pEVar5 = ((pX->x).pSelect)->pEList;
    uVar12 = pEVar5->nExpr;
    if ((int)uVar12 < 1) {
      uVar24 = 0;
    }
    else {
      pEVar23 = pEVar5->a;
      uVar25 = 0;
      do {
        iVar11 = sqlite3ExprCanBeNull(pEVar23->pExpr);
        if (iVar11 != 0) goto LAB_0017ce87;
        uVar25 = uVar25 + 1;
        pEVar23 = pEVar23 + 1;
      } while (uVar12 != uVar25);
      uVar25 = (ulong)uVar12;
LAB_0017ce87:
      uVar24 = (uint)uVar25;
    }
    if (uVar24 == uVar12) {
      prRhsHasNull = (int *)0x0;
    }
  }
  if ((((((pParse->nErr == 0) && ((pX->flags & 0x1040) == 0x1000)) &&
        (pSVar15 = (pX->x).pSelect, pSVar15->pPrior == (Select *)0x0)) &&
       (((pSVar15->selFlags & 9) == 0 && (pSVar15->pLimit == (Expr *)0x0)))) &&
      ((pSVar15->pWhere == (Expr *)0x0 &&
       ((pSVar6 = pSVar15->pSrc, pSVar6->nSrc == 1 && ((pSVar6->a[0].fg.field_0x1 & 4) == 0)))))) &&
     (pTab = pSVar6->a[0].pSTab, pTab->eTabType != '\x01')) {
    uVar12 = pSVar15->pEList->nExpr;
    uVar25 = (ulong)uVar12;
    pEVar23 = pSVar15->pEList->a;
    if (0 < (int)uVar12) {
      lVar16 = 0;
      do {
        if (**(char **)((long)&pEVar23->pExpr + lVar16) != -0x58) goto LAB_0017cf00;
        lVar16 = lVar16 + 0x18;
      } while (uVar25 * 0x18 != lVar16);
      if (pSVar15 == (Select *)0x0) goto LAB_0017cf00;
    }
    if (pTab->pSchema == (Schema *)0x0) {
      iVar11 = -0x8000;
    }
    else {
      iVar11 = -1;
      ppSVar17 = &pParse->db->aDb->pSchema;
      do {
        iVar11 = iVar11 + 1;
        pSVar7 = *ppSVar17;
        ppSVar17 = ppSVar17 + 4;
      } while (pSVar7 != pTab->pSchema);
    }
    sqlite3CodeVerifySchema(pParse,iVar11);
    sqlite3TableLock(pParse,iVar11,pTab->tnum,'\0',pTab->zName);
    if (uVar12 != 1) {
      if (0 < (int)uVar12) goto LAB_0017d28a;
LAB_0017d30d:
      pIdx = pTab->pIndex;
      if (pIdx != (Index *)0x0) {
        do {
          uVar4 = pIdx->nColumn;
          if (((((int)uVar12 <= (int)(uint)uVar4) && (uVar4 < 0x3f)) &&
              (pIdx->pPartIdxWhere == (Expr *)0x0)) &&
             (((inFlags & 4) == 0 ||
              (((int)(uint)pIdx->nKeyCol <= (int)uVar12 &&
               ((uVar4 <= uVar12 || (pIdx->onError != '\0')))))))) {
            if (0 < (int)uVar12) {
              uVar21 = 0;
              uVar22 = 0;
              do {
                pLeft = sqlite3VectorFieldSubexpr(pX->pLeft,(int)uVar21);
                pEVar13 = pEVar23[uVar21].pExpr;
                pCVar14 = sqlite3BinaryCompareCollSeq(pParse,pLeft,pEVar13);
                uVar19 = 0;
LAB_0017d3bc:
                if (pIdx->aiColumn[uVar19] != pEVar13->iColumn) goto LAB_0017d3ff;
                if (pCVar14 != (CollSeq *)0x0) {
                  lVar16 = 0;
                  do {
                    bVar1 = pCVar14->zName[lVar16];
                    if (bVar1 == pIdx->azColl[uVar19][lVar16]) {
                      if ((ulong)bVar1 == 0) break;
                    }
                    else if (""[bVar1] != ""[(byte)pIdx->azColl[uVar19][lVar16]]) goto LAB_0017d3ff;
                    lVar16 = lVar16 + 1;
                  } while( true );
                }
                if ((uVar12 == (uint)uVar19) || ((uVar22 >> (uVar19 & 0x3f) & 1) != 0))
                goto LAB_0017d480;
                if (aiMap != (int *)0x0) {
                  aiMap[uVar21] = (uint)uVar19;
                }
                uVar22 = uVar22 | 1L << ((byte)uVar19 & 0x3f);
                uVar21 = uVar21 + 1;
                if (uVar21 == uVar25) goto LAB_0017d480;
              } while( true );
            }
            uVar22 = 0;
LAB_0017d480:
            if ((uVar22 ^ -1L << ((byte)uVar12 & 0x3f)) == 0xffffffffffffffff) {
              iVar20 = sqlite3VdbeAddOp3(p,0xf,0,0,0);
              sqlite3VdbeExplain(pParse,'\0',"USING INDEX %s FOR IN-OPERATOR",pIdx->zName);
              sqlite3VdbeAddOp3(p,0x66,p1,pIdx->tnum,iVar11);
              sqlite3VdbeSetP4KeyInfo(pParse,pIdx);
              bVar1 = *pIdx->aSortOrder;
              if (prRhsHasNull != (int *)0x0) {
                iVar11 = pParse->nMem + 1;
                pParse->nMem = iVar11;
                *prRhsHasNull = iVar11;
                if (uVar12 == 1) {
                  sqlite3SetHasNullFlag(p,p1,iVar11);
                }
              }
              if (p->db->mallocFailed == '\0') {
                pOVar18 = p->aOp + iVar20;
              }
              else {
                pOVar18 = (Op *)&sqlite3VdbeGetOp_dummy;
              }
              iVar11 = bVar1 + 3;
              pOVar18->p2 = p->nOp;
              goto LAB_0017d02e;
            }
          }
          pIdx = pIdx->pNext;
        } while (pIdx != (Index *)0x0);
      }
      goto LAB_0017cf00;
    }
    if (-1 < pEVar23->pExpr->iColumn) {
LAB_0017d28a:
      uVar21 = 0;
      pEVar26 = pEVar23;
      do {
        pEVar13 = sqlite3VectorFieldSubexpr(pX->pLeft,(int)uVar21);
        sVar3 = pEVar26->pExpr->iColumn;
        aff2 = 'D';
        if ((-1 < (long)sVar3) && (sVar3 < pTab->nCol)) {
          aff2 = pTab->aCol[sVar3].affinity;
        }
        cVar10 = sqlite3CompareAffinity(pEVar13,aff2);
        bVar27 = 1 < (byte)(cVar10 + 0xbfU);
        if (aff2 < 'C' && bVar27) break;
        uVar21 = uVar21 + 1;
        pEVar26 = pEVar26 + 1;
      } while (uVar21 < uVar25);
      if (aff2 < 'C' && bVar27) goto LAB_0017cf00;
      goto LAB_0017d30d;
    }
    iVar20 = sqlite3VdbeAddOp3(p,0xf,0,0,0);
    sqlite3OpenTable(pParse,p1,iVar11,pTab,0x66);
    sqlite3VdbeExplain(pParse,'\0',"USING ROWID SEARCH ON TABLE %s FOR IN-OPERATOR",pTab->zName);
    if (p->db->mallocFailed == '\0') {
      pOVar18 = p->aOp + iVar20;
    }
    else {
      pOVar18 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    pOVar18->p2 = p->nOp;
    iVar11 = 1;
  }
  else {
LAB_0017cf00:
    if (((inFlags & 1) != 0) && ((pX->flags & 0x1000) == 0)) {
      pEVar13 = pX->pLeft;
      pX->pLeft = (Expr *)0x0;
      local_68.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)&DAT_aaaaaaaaaaaaaaaa;
      local_68.u.pNC = (NameContext *)&DAT_aaaaaaaaaaaaaaaa;
      local_68.walkerDepth = -0x55555556;
      local_68.eCode = 1;
      local_68.mWFlags = 0xaaaa;
      local_68.xExprCallback = exprNodeIsConstant;
      local_68.xSelectCallback = sqlite3SelectWalkFail;
      local_68.pParse = pParse;
      sqlite3WalkExprNN(&local_68,pX);
      pX->pLeft = pEVar13;
      if ((local_68.eCode == 0) || (((pX->x).pList)->nExpr < 3)) {
        pParse->nTab = pParse->nTab + -1;
        iVar11 = 5;
        p1 = -1;
        goto LAB_0017d02e;
      }
    }
    LVar2 = pParse->nQueryLoop;
    if ((inFlags & 4) == 0) {
      if (prRhsHasNull == (int *)0x0) goto LAB_0017d013;
      iVar20 = pParse->nMem;
      iVar11 = iVar20 + 1;
      pParse->nMem = iVar11;
      *prRhsHasNull = iVar11;
      sqlite3CodeRhsOfIN(pParse,pX,p1);
      iVar20 = iVar20 + 1;
      if (iVar20 != 0) {
        sqlite3SetHasNullFlag(p,p1,iVar20);
      }
    }
    else {
      pParse->nQueryLoop = 0;
LAB_0017d013:
      sqlite3CodeRhsOfIN(pParse,pX,p1);
    }
    pParse->nQueryLoop = LVar2;
    iVar11 = 2;
  }
LAB_0017d02e:
  auVar8 = _DAT_001ff0a0;
  if ((aiMap == (int *)0x0) || (0xfffffffd < iVar11 - 5U)) goto LAB_0017d109;
  pSVar15 = (Select *)pX->pLeft;
  uVar9 = pSVar15->op;
  if (uVar9 == 0xb0) {
    uVar9 = *(u8 *)&pSVar15->nSelectRow;
  }
  if (uVar9 == 0xb1) {
LAB_0017d06d:
    uVar12 = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar15->pEList)->pList->nExpr;
    if ((int)uVar12 < 1) goto LAB_0017d109;
  }
  else {
    uVar12 = 1;
    if (uVar9 == 0x8b) {
      pSVar15 = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar15->pEList)->pSelect;
      goto LAB_0017d06d;
    }
  }
  lVar16 = (ulong)uVar12 - 1;
  auVar28._8_4_ = (int)lVar16;
  auVar28._0_8_ = lVar16;
  auVar28._12_4_ = (int)((ulong)lVar16 >> 0x20);
  uVar25 = 0;
  auVar28 = auVar28 ^ _DAT_001ff0a0;
  auVar29 = _DAT_001ff090;
  do {
    auVar30 = auVar29 ^ auVar8;
    if ((bool)(~(auVar30._4_4_ == auVar28._4_4_ && auVar28._0_4_ < auVar30._0_4_ ||
                auVar28._4_4_ < auVar30._4_4_) & 1)) {
      aiMap[uVar25] = (int)uVar25;
    }
    if ((auVar30._12_4_ != auVar28._12_4_ || auVar30._8_4_ <= auVar28._8_4_) &&
        auVar30._12_4_ <= auVar28._12_4_) {
      aiMap[uVar25 + 1] = (int)uVar25 + 1;
    }
    uVar25 = uVar25 + 2;
    lVar16 = auVar29._8_8_;
    auVar29._0_8_ = auVar29._0_8_ + 2;
    auVar29._8_8_ = lVar16 + 2;
  } while ((uVar12 + 1 & 0xfffffffe) != uVar25);
LAB_0017d109:
  *piTab = p1;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar11;
LAB_0017d3ff:
  uVar19 = uVar19 + 1;
  if (uVar19 == uVar25) goto LAB_0017d480;
  goto LAB_0017d3bc;
}

Assistant:

SQLITE_PRIVATE int sqlite3FindInIndex(
  Parse *pParse,             /* Parsing context */
  Expr *pX,                  /* The IN expression */
  u32 inFlags,               /* IN_INDEX_LOOP, _MEMBERSHIP, and/or _NOOP_OK */
  int *prRhsHasNull,         /* Register holding NULL status.  See notes */
  int *aiMap,                /* Mapping from Index fields to RHS fields */
  int *piTab                 /* OUT: index to use */
){
  Select *p;                            /* SELECT to the right of IN operator */
  int eType = 0;                        /* Type of RHS table. IN_INDEX_* */
  int iTab;                             /* Cursor of the RHS table */
  int mustBeUnique;                     /* True if RHS must be unique */
  Vdbe *v = sqlite3GetVdbe(pParse);     /* Virtual machine being coded */

  assert( pX->op==TK_IN );
  mustBeUnique = (inFlags & IN_INDEX_LOOP)!=0;
  iTab = pParse->nTab++;

  /* If the RHS of this IN(...) operator is a SELECT, and if it matters
  ** whether or not the SELECT result contains NULL values, check whether
  ** or not NULL is actually possible (it may not be, for example, due
  ** to NOT NULL constraints in the schema). If no NULL values are possible,
  ** set prRhsHasNull to 0 before continuing.  */
  if( prRhsHasNull && ExprUseXSelect(pX) ){
    int i;
    ExprList *pEList = pX->x.pSelect->pEList;
    for(i=0; i<pEList->nExpr; i++){
      if( sqlite3ExprCanBeNull(pEList->a[i].pExpr) ) break;
    }
    if( i==pEList->nExpr ){
      prRhsHasNull = 0;
    }
  }

  /* Check to see if an existing table or index can be used to
  ** satisfy the query.  This is preferable to generating a new
  ** ephemeral table.  */
  if( pParse->nErr==0 && (p = isCandidateForInOpt(pX))!=0 ){
    sqlite3 *db = pParse->db;              /* Database connection */
    Table *pTab;                           /* Table <table>. */
    int iDb;                               /* Database idx for pTab */
    ExprList *pEList = p->pEList;
    int nExpr = pEList->nExpr;

    assert( p->pEList!=0 );             /* Because of isCandidateForInOpt(p) */
    assert( p->pEList->a[0].pExpr!=0 ); /* Because of isCandidateForInOpt(p) */
    assert( p->pSrc!=0 );               /* Because of isCandidateForInOpt(p) */
    pTab = p->pSrc->a[0].pSTab;

    /* Code an OP_Transaction and OP_TableLock for <table>. */
    iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
    assert( iDb>=0 && iDb<SQLITE_MAX_DB );
    sqlite3CodeVerifySchema(pParse, iDb);
    sqlite3TableLock(pParse, iDb, pTab->tnum, 0, pTab->zName);

    assert(v);  /* sqlite3GetVdbe() has always been previously called */
    if( nExpr==1 && pEList->a[0].pExpr->iColumn<0 ){
      /* The "x IN (SELECT rowid FROM table)" case */
      int iAddr = sqlite3VdbeAddOp0(v, OP_Once);
      VdbeCoverage(v);

      sqlite3OpenTable(pParse, iTab, iDb, pTab, OP_OpenRead);
      eType = IN_INDEX_ROWID;
      ExplainQueryPlan((pParse, 0,
            "USING ROWID SEARCH ON TABLE %s FOR IN-OPERATOR",pTab->zName));
      sqlite3VdbeJumpHere(v, iAddr);
    }else{
      Index *pIdx;                         /* Iterator variable */
      int affinity_ok = 1;
      int i;

      /* Check that the affinity that will be used to perform each
      ** comparison is the same as the affinity of each column in table
      ** on the RHS of the IN operator.  If it not, it is not possible to
      ** use any index of the RHS table.  */
      for(i=0; i<nExpr && affinity_ok; i++){
        Expr *pLhs = sqlite3VectorFieldSubexpr(pX->pLeft, i);
        int iCol = pEList->a[i].pExpr->iColumn;
        char idxaff = sqlite3TableColumnAffinity(pTab,iCol); /* RHS table */
        char cmpaff = sqlite3CompareAffinity(pLhs, idxaff);
        testcase( cmpaff==SQLITE_AFF_BLOB );
        testcase( cmpaff==SQLITE_AFF_TEXT );
        switch( cmpaff ){
          case SQLITE_AFF_BLOB:
            break;
          case SQLITE_AFF_TEXT:
            /* sqlite3CompareAffinity() only returns TEXT if one side or the
            ** other has no affinity and the other side is TEXT.  Hence,
            ** the only way for cmpaff to be TEXT is for idxaff to be TEXT
            ** and for the term on the LHS of the IN to have no affinity. */
            assert( idxaff==SQLITE_AFF_TEXT );
            break;
          default:
            affinity_ok = sqlite3IsNumericAffinity(idxaff);
        }
      }

      if( affinity_ok ){
        /* Search for an existing index that will work for this IN operator */
        for(pIdx=pTab->pIndex; pIdx && eType==0; pIdx=pIdx->pNext){
          Bitmask colUsed;      /* Columns of the index used */
          Bitmask mCol;         /* Mask for the current column */
          if( pIdx->nColumn<nExpr ) continue;
          if( pIdx->pPartIdxWhere!=0 ) continue;
          /* Maximum nColumn is BMS-2, not BMS-1, so that we can compute
          ** BITMASK(nExpr) without overflowing */
          testcase( pIdx->nColumn==BMS-2 );
          testcase( pIdx->nColumn==BMS-1 );
          if( pIdx->nColumn>=BMS-1 ) continue;
          if( mustBeUnique ){
            if( pIdx->nKeyCol>nExpr
             ||(pIdx->nColumn>nExpr && !IsUniqueIndex(pIdx))
            ){
              continue;  /* This index is not unique over the IN RHS columns */
            }
          }

          colUsed = 0;   /* Columns of index used so far */
          for(i=0; i<nExpr; i++){
            Expr *pLhs = sqlite3VectorFieldSubexpr(pX->pLeft, i);
            Expr *pRhs = pEList->a[i].pExpr;
            CollSeq *pReq = sqlite3BinaryCompareCollSeq(pParse, pLhs, pRhs);
            int j;

            for(j=0; j<nExpr; j++){
              if( pIdx->aiColumn[j]!=pRhs->iColumn ) continue;
              assert( pIdx->azColl[j] );
              if( pReq!=0 && sqlite3StrICmp(pReq->zName, pIdx->azColl[j])!=0 ){
                continue;
              }
              break;
            }
            if( j==nExpr ) break;
            mCol = MASKBIT(j);
            if( mCol & colUsed ) break; /* Each column used only once */
            colUsed |= mCol;
            if( aiMap ) aiMap[i] = j;
          }

          assert( nExpr>0 && nExpr<BMS );
          assert( i==nExpr || colUsed!=(MASKBIT(nExpr)-1) );
          if( colUsed==(MASKBIT(nExpr)-1) ){
            /* If we reach this point, that means the index pIdx is usable */
            int iAddr = sqlite3VdbeAddOp0(v, OP_Once); VdbeCoverage(v);
            ExplainQueryPlan((pParse, 0,
                              "USING INDEX %s FOR IN-OPERATOR",pIdx->zName));
            sqlite3VdbeAddOp3(v, OP_OpenRead, iTab, pIdx->tnum, iDb);
            sqlite3VdbeSetP4KeyInfo(pParse, pIdx);
            VdbeComment((v, "%s", pIdx->zName));
            assert( IN_INDEX_INDEX_DESC == IN_INDEX_INDEX_ASC+1 );
            eType = IN_INDEX_INDEX_ASC + pIdx->aSortOrder[0];

            if( prRhsHasNull ){
#ifdef SQLITE_ENABLE_COLUMN_USED_MASK
              i64 mask = (1<<nExpr)-1;
              sqlite3VdbeAddOp4Dup8(v, OP_ColumnsUsed,
                  iTab, 0, 0, (u8*)&mask, P4_INT64);
#endif
              *prRhsHasNull = ++pParse->nMem;
              if( nExpr==1 ){
                sqlite3SetHasNullFlag(v, iTab, *prRhsHasNull);
              }
            }
            sqlite3VdbeJumpHere(v, iAddr);
          }
        } /* End loop over indexes */
      } /* End if( affinity_ok ) */
    } /* End if not an rowid index */
  } /* End attempt to optimize using an index */

  /* If no preexisting index is available for the IN clause
  ** and IN_INDEX_NOOP is an allowed reply
  ** and the RHS of the IN operator is a list, not a subquery
  ** and the RHS is not constant or has two or fewer terms,
  ** then it is not worth creating an ephemeral table to evaluate
  ** the IN operator so return IN_INDEX_NOOP.
  */
  if( eType==0
   && (inFlags & IN_INDEX_NOOP_OK)
   && ExprUseXList(pX)
   && (!sqlite3InRhsIsConstant(pParse,pX) || pX->x.pList->nExpr<=2)
  ){
    pParse->nTab--;  /* Back out the allocation of the unused cursor */
    iTab = -1;       /* Cursor is not allocated */
    eType = IN_INDEX_NOOP;
  }

  if( eType==0 ){
    /* Could not find an existing table or index to use as the RHS b-tree.
    ** We will have to generate an ephemeral table to do the job.
    */
    u32 savedNQueryLoop = pParse->nQueryLoop;
    int rMayHaveNull = 0;
    eType = IN_INDEX_EPH;
    if( inFlags & IN_INDEX_LOOP ){
      pParse->nQueryLoop = 0;
    }else if( prRhsHasNull ){
      *prRhsHasNull = rMayHaveNull = ++pParse->nMem;
    }
    assert( pX->op==TK_IN );
    sqlite3CodeRhsOfIN(pParse, pX, iTab);
    if( rMayHaveNull ){
      sqlite3SetHasNullFlag(v, iTab, rMayHaveNull);
    }
    pParse->nQueryLoop = savedNQueryLoop;
  }

  if( aiMap && eType!=IN_INDEX_INDEX_ASC && eType!=IN_INDEX_INDEX_DESC ){
    int i, n;
    n = sqlite3ExprVectorSize(pX->pLeft);
    for(i=0; i<n; i++) aiMap[i] = i;
  }
  *piTab = iTab;
  return eType;
}